

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::SelectRows::dim_forward
          (Dim *__return_storage_ptr__,SelectRows *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer pDVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  uint uVar4;
  uint *puVar5;
  initializer_list<unsigned_int> x;
  size_type sStack_30;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pDVar2 == 0x24) &&
     (uVar1 = pDVar2->nd, uVar1 < 3)) {
    uVar4 = (uint)((ulong)((long)(this->prows->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->prows->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
    if (uVar1 == 1) {
      puVar5 = &local_14;
      sStack_30 = 1;
      local_14 = uVar4;
    }
    else {
      if (uVar1 == 2) {
        local_18 = pDVar2->d[1];
      }
      else {
        local_18 = 1;
      }
      puVar5 = &local_1c;
      sStack_30 = 2;
      local_1c = uVar4;
    }
    x._M_len = sStack_30;
    x._M_array = puVar5;
    Dim::Dim(__return_storage_ptr__,x);
    return __return_storage_ptr__;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Bad arguments in SelectRows: ");
  poVar3 = operator<<(poVar3,xs);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to SelectRows");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim SelectRows::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || xs[0].ndims() > 2) {
    cerr << "Bad arguments in SelectRows: " << xs << endl;
    throw std::invalid_argument("invalid arguments to SelectRows");
  }
  unsigned nrows = prows->size();
  if (xs[0].ndims() == 1) return Dim({nrows});
  return Dim({nrows, xs[0].cols()});
}